

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O2

void __thiscall
pbrt::ParallelForLoop1D::ParallelForLoop1D
          (ParallelForLoop1D *this,int64_t startIndex,int64_t endIndex,int chunkSize,
          function<void_(long,_long)> *func)

{
  (this->super_ParallelJob).activeWorkers = 0;
  (this->super_ParallelJob).removed = false;
  (this->super_ParallelJob).prev = (ParallelJob *)0x0;
  (this->super_ParallelJob).next = (ParallelJob *)0x0;
  (this->super_ParallelJob)._vptr_ParallelJob = (_func_int **)&PTR__ParallelForLoop1D_02eef2e0;
  std::function<void_(long,_long)>::function(&this->func,func);
  this->nextIndex = startIndex;
  this->endIndex = endIndex;
  this->chunkSize = chunkSize;
  return;
}

Assistant:

ParallelForLoop1D(int64_t startIndex, int64_t endIndex, int chunkSize,
                      std::function<void(int64_t, int64_t)> func)
        : func(std::move(func)),
          nextIndex(startIndex),
          endIndex(endIndex),
          chunkSize(chunkSize) {}